

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_db.c
# Opt level: O0

int cfg_db_remove_element
              (cfg_db *db,char *section_type,char *section_name,char *entry_name,char *value)

{
  int iVar1;
  cfg_entry *entry_00;
  long lVar2;
  size_t sVar3;
  bool bVar4;
  char *local_60;
  char *ptr;
  cfg_entry *entry;
  char *value_local;
  char *entry_name_local;
  char *section_name_local;
  char *section_type_local;
  cfg_db *db_local;
  
  entry_00 = cfg_db_find_entry(db,section_type,section_name,entry_name);
  if (entry_00 == (cfg_entry *)0x0) {
    db_local._4_4_ = -1;
  }
  else {
    lVar2 = strarray_get(&entry_00->val,1);
    if (lVar2 == 0) {
      iVar1 = strcmp(value,(entry_00->val).value);
      if (iVar1 == 0) {
        _free_entry(entry_00);
        db_local._4_4_ = 0;
      }
      else {
        db_local._4_4_ = -1;
      }
    }
    else {
      local_60 = (entry_00->val).value;
      while( true ) {
        bVar4 = false;
        if (local_60 != (char *)0x0) {
          bVar4 = local_60 < (entry_00->val).value + (entry_00->val).length;
        }
        if (!bVar4) {
          return -1;
        }
        iVar1 = strcmp(local_60,value);
        if (iVar1 == 0) break;
        sVar3 = strlen(local_60);
        local_60 = local_60 + sVar3 + 1;
      }
      strarray_remove_ext(&entry_00->val,local_60,1);
      db_local._4_4_ = 0;
    }
  }
  return db_local._4_4_;
}

Assistant:

int
cfg_db_remove_element(
  struct cfg_db *db, const char *section_type, const char *section_name, const char *entry_name, const char *value) {
  struct cfg_entry *entry;
  char *ptr;

  /* find entry */
  entry = cfg_db_find_entry(db, section_type, section_name, entry_name);
  if (entry == NULL) {
    return -1;
  }

  if (!cfg_db_is_multipart_entry(entry)) {
    /* only a single element in list */
    if (strcmp(value, entry->val.value) == 0) {
      _free_entry(entry);
      return 0;
    }
    return -1;
  }

  strarray_for_each_element(&entry->val, ptr) {
    if (strcmp(ptr, value) == 0) {
      strarray_remove(&entry->val, ptr);
      return 0;
    }
  }

  /* element not in list */
  return -1;
}